

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_declaration.c
# Opt level: O0

void free_type_specifier(c_type_specifier_t *type_specifier)

{
  c_type_specifier_t *type_specifier_local;
  
  if (type_specifier->type == C_TYPE_SPECIFIER_IDENT) {
    free_type_specifier_ident((c_type_specifier_ident_t *)type_specifier);
  }
  else if (type_specifier->type == C_TYPE_SPECIFIER_STRUCT) {
    free_type_specifier_struct((c_type_specifier_struct_t *)type_specifier);
  }
  free(type_specifier);
  return;
}

Assistant:

static void free_type_specifier(c_type_specifier_t *type_specifier)
{
    switch (type_specifier->type) {
    case C_TYPE_SPECIFIER_IDENT:
        free_type_specifier_ident((c_type_specifier_ident_t *)type_specifier);
        break;
    case C_TYPE_SPECIFIER_STRUCT:
        free_type_specifier_struct((c_type_specifier_struct_t *)type_specifier);
        break;
    }

    free(type_specifier);
}